

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,char c,size_type pos)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < (long)this->length_) {
    uVar2 = (long)this->length_ - 1;
    if (pos <= uVar2) {
      uVar2 = pos;
    }
    if (-1 < (int)uVar2) {
      do {
        if (this->ptr_[uVar2 & 0xffffffff] == c) {
          return uVar2 & 0xffffffff;
        }
        iVar1 = (int)uVar2;
        uVar2 = (ulong)(iVar1 - 1);
      } while (0 < iVar1);
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

StringPiece::size_type StringPiece::rfind(char c, size_type pos) const {
  if (length_ <= 0) return npos;
  for (int i = static_cast<int>(min(pos, static_cast<size_type>(length_ - 1)));
       i >= 0; --i) {
    if (ptr_[i] == c) {
      return i;
    }
  }
  return npos;
}